

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetHeaderRowHeight(void)

{
  undefined1 auVar1 [16];
  float wrap_width;
  uint uVar2;
  ImGuiStyle *pIVar3;
  float lhs;
  undefined1 auVar4 [64];
  char *unaff_retaddr;
  char *in_stack_00000008;
  ImGuiTableColumnFlags flags;
  int column_n;
  int columns_count;
  float row_height;
  int in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  int local_c;
  float fVar5;
  undefined1 extraout_var [56];
  
  lhs = GetTextLineHeight();
  wrap_width = (float)TableGetColumnCount();
  for (local_c = 0; local_c < (int)wrap_width; local_c = local_c + 1) {
    uVar2 = TableGetColumnFlags(in_stack_ffffffffffffffe0);
    if (((uVar2 & 0x1000000) != 0) && ((uVar2 & 0x1000) == 0)) {
      fVar5 = lhs;
      TableGetColumnName((int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
      auVar4._0_8_ = CalcTextSize(in_stack_00000008,unaff_retaddr,SUB41((uint)fVar5 >> 0x18,0),
                                  wrap_width);
      auVar4._8_56_ = extraout_var;
      in_stack_ffffffffffffffe8 = vmovlpd_avx(auVar4._0_16_);
      lhs = ImMax<float>(lhs,(float)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    }
  }
  pIVar3 = GetStyle();
  auVar1 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)(pIVar3->CellPadding).y),
                           ZEXT416((uint)lhs));
  return auVar1._0_4_;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        ImGuiTableColumnFlags flags = TableGetColumnFlags(column_n);
        if ((flags & ImGuiTableColumnFlags_IsEnabled) && !(flags & ImGuiTableColumnFlags_NoHeaderLabel))
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    }
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}